

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void test_skipping(char *fmt,...)

{
  char *in_RDI;
  va_list ap;
  char buff [1024];
  undefined4 local_428;
  undefined4 local_424;
  char local_408 [1024];
  char *local_8;
  
  local_424 = 0x30;
  local_428 = 8;
  local_8 = in_RDI;
  vsprintf(local_408,in_RDI,&local_428);
  msg = nextmsg;
  nextmsg = (char *)0x0;
  failure_start(skipping_filename,(wchar_t)(ulong)(uint)skipping_line,"SKIPPING: %s",local_408);
  failures = failures + L'\xffffffff';
  failed_lines[skipping_line].skip = 1;
  skips = skips + L'\x01';
  return;
}

Assistant:

void
test_skipping(const char *fmt, ...)
{
	char buff[1024];
	va_list ap;

	va_start(ap, fmt);
	vsprintf(buff, fmt, ap);
	va_end(ap);
	/* Use failure() message if set. */
	msg = nextmsg;
	nextmsg = NULL;
	/* failure_start() isn't quite right, but is awfully convenient. */
	failure_start(skipping_filename, skipping_line, "SKIPPING: %s", buff);
	--failures; /* Undo failures++ in failure_start() */
	/* Don't failure_finish() here. */
	/* Mark as skip, so doesn't count as failed test. */
	failed_lines[skipping_line].skip = 1;
	++skips;
}